

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_snode_common
               (lyout *out,int level,lys_node *node,lys_module *module,int *par_close_flag,int mask)

{
  ushort uVar1;
  int iVar2;
  lys_node *plVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (((mask & 1U) != 0) && (node->ext_size != '\0')) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_extension_instances
              (out,level,module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size);
  }
  if ((mask & 2U) != 0) {
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < node->iffeature_size; uVar5 = uVar5 + 1) {
      yin_print_close_parent(out,par_close_flag);
      yin_print_iffeature(out,level,module,(lys_iffeature *)((long)&node->iffeature->expr + lVar4));
      lVar4 = lVar4 + 0x20;
    }
  }
  if ((mask & 4U) != 0) {
    iVar2 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_CONFIG);
    plVar3 = lys_parent(node);
    uVar1 = node->flags;
    if (plVar3 == (lys_node *)0x0) {
      if ((uVar1 & 2) == 0) {
        if (iVar2 != -1) goto LAB_001863d1;
      }
      else {
LAB_001863da:
        pcVar6 = "false";
LAB_001863e1:
        yin_print_close_parent(out,par_close_flag);
        yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',pcVar6,module,node->ext,
                          (uint)node->ext_size);
      }
    }
    else if (iVar2 != -1 || (uVar1 & 4) != 0) {
      if ((uVar1 & 1) != 0) {
LAB_001863d1:
        pcVar6 = "true";
        goto LAB_001863e1;
      }
      if ((uVar1 & 2) != 0) goto LAB_001863da;
    }
  }
  if (((mask & 8U) != 0) && ((node->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) != LYS_UNKNOWN)) {
    if ((node->flags & 0x40) == 0) {
      if (-1 < (char)node->flags) goto LAB_00186465;
      pcVar6 = "false";
    }
    else {
      pcVar6 = "true";
    }
    yin_print_close_parent(out,par_close_flag);
    yin_print_substmt(out,level,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar6,module,node->ext,
                      (uint)node->ext_size);
  }
LAB_00186465:
  if ((mask & 0x10U) == 0) goto LAB_001864c5;
  uVar1 = node->flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x10) != 0) {
      pcVar6 = "deprecated";
      goto LAB_00186499;
    }
    if ((uVar1 & 0x20) != 0) {
      pcVar6 = "obsolete";
      goto LAB_00186499;
    }
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = "current";
LAB_00186499:
    yin_print_close_parent(out,par_close_flag);
  }
  yin_print_substmt(out,level,LYEXT_SUBSTMT_STATUS,'\0',pcVar6,module,node->ext,(uint)node->ext_size
                   );
LAB_001864c5:
  if (((mask & 0x20U) != 0) && (node->dsc != (char *)0x0)) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_substmt(out,level,LYEXT_SUBSTMT_DESCRIPTION,'\0',node->dsc,module,node->ext,
                      (uint)node->ext_size);
  }
  if (((mask & 0x40U) != 0) && (node->ref != (char *)0x0)) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_substmt(out,level,LYEXT_SUBSTMT_REFERENCE,'\0',node->ref,module,node->ext,
                      (uint)node->ext_size);
  }
  return;
}

Assistant:

static void
yin_print_snode_common(struct lyout *out, int level, const struct lys_node *node, const struct lys_module *module,
                       int *par_close_flag, int mask)
{
    int i;
    const char *status = NULL;

    /* extensions */
    if ((mask & SNODE_COMMON_EXT) && node->ext_size) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, node->ext, node->ext_size);
    }

    /* if-features */
    if (mask & SNODE_COMMON_IFF) {
        for (i = 0; i < node->iffeature_size; ++i) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_iffeature(out, level, module, &node->iffeature[i]);
        }
    }

    /* config */
    if (mask & SNODE_COMMON_CONFIG) {
        /* get info if there is an extension for the config statement */
        i = lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_CONFIG);

        if (lys_parent(node)) {
            if ((node->flags & LYS_CONFIG_SET) || i != -1) {
                /* print config when it differs from the parent or if it has an extension instance ... */
                if (node->flags & LYS_CONFIG_W) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                                      module, node->ext, node->ext_size);
                } else if (node->flags & LYS_CONFIG_R) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                                      module, node->ext, node->ext_size);
                }
            }
        } else if (node->flags & LYS_CONFIG_R) {
            /* ... or it's a top-level state node */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                              module, node->ext, node->ext_size);
        } else if (i != -1) {
            /* the config has an extension, so we have to print it */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                              module, node->ext, node->ext_size);
        }
    }

    /* mandatory */
    if ((mask & SNODE_COMMON_MAND) && (node->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        if (node->flags & LYS_MAND_TRUE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true",
                              module, node->ext, node->ext_size);
        } else if (node->flags & LYS_MAND_FALSE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false",
                              module, node->ext, node->ext_size);
        }
    }

    /* status */
    if (mask & SNODE_COMMON_STATUS) {
        if (node->flags & LYS_STATUS_CURR) {
            yin_print_close_parent(out, par_close_flag);
            status = "current";
        } else if (node->flags & LYS_STATUS_DEPRC) {
            yin_print_close_parent(out, par_close_flag);
            status = "deprecated";
        } else if (node->flags & LYS_STATUS_OBSLT) {
            yin_print_close_parent(out, par_close_flag);
            status = "obsolete";
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_STATUS, 0, status, module, node->ext, node->ext_size);
    }

    /* description */
    if ((mask & SNODE_COMMON_DSC) && node->dsc) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, node->dsc,
                           module, node->ext, node->ext_size);
    }

    /* reference */
    if ((mask & SNODE_COMMON_REF) && node->ref) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, node->ref,
                          module, node->ext, node->ext_size);
    }
}